

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::write<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,char16_t *s,
          basic_format_specs<char16_t> *specs,locale_ref param_4)

{
  presentation_type pVar1;
  long lVar2;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar3;
  size_t sVar4;
  basic_string_view<char16_t> s_00;
  
  pVar1 = specs->type;
  if ((1 < pVar1 - 0x10) && (pVar1 != none)) {
    fmt::v8::detail::throw_format_error("invalid type specifier");
  }
  if ((pVar1 & ~string) != none) {
    bVar3 = write_ptr<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_long>
                      (out,(unsigned_long)s,specs);
    return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar3.container;
  }
  sVar4 = 0xffffffffffffffff;
  do {
    lVar2 = sVar4 + 1;
    sVar4 = sVar4 + 1;
  } while (s[lVar2] != L'\0');
  s_00.size_ = sVar4;
  s_00.data_ = s;
  bVar3 = write<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                    (out,s_00,specs,(locale_ref)0x0);
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, const Char* s,
                         const basic_format_specs<Char>& specs, locale_ref)
    -> OutputIt {
  return check_cstring_type_spec(specs.type)
             ? write(out, basic_string_view<Char>(s), specs, {})
             : write_ptr<Char>(out, to_uintptr(s), &specs);
}